

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,write_shape_ini>
          (xr_ini_writer *this,
          vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_> *container)

{
  bool bVar1;
  reference s;
  __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  uint32_t id;
  vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_> *container_local;
  xr_ini_writer *this_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::begin(container);
  local_38._M_current =
       (shape_def *)
       std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    s = __gnu_cxx::
        __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
        ::operator*(&end);
    write_shape_ini::operator()
              ((write_shape_ini *)((long)&this_local + 7),s,this,it._M_current._4_4_);
    __gnu_cxx::
    __normal_iterator<const_xray_re::shape_def_*,_std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}